

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_folders.cpp
# Opt level: O0

void sago::internal::appendExtraFoldersTokenizer
               (char *envName,char *envValue,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *folders)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined1 local_200 [8];
  string value;
  allocator<char> local_1c9;
  string local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *folders_local;
  char *envValue_local;
  char *envName_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,envValue,&local_1c9);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1a8,local_1c8,_Var2);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::__cxx11::string::string((string *)local_200);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a8,(string *)local_200,':');
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_200);
    if (*pcVar4 == '/') {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(folders,(value_type *)local_200);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Skipping path \"");
      poVar5 = std::operator<<(poVar5,(string *)local_200);
      poVar5 = std::operator<<(poVar5,"\" in \"");
      poVar5 = std::operator<<(poVar5,envName);
      std::operator<<(poVar5,"\" because it does not start with a \"/\"\n");
    }
  }
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void appendExtraFoldersTokenizer(const char* envName, const char* envValue, std::vector<std::string>& folders) {
	std::stringstream ss(envValue);
	std::string value;
	while (std::getline(ss, value, ':')) {
		if (value[0] == '/') {
			folders.push_back(value);
		}
		else {
			//Unless the system is wrongly configured this should never happen... But of course some systems will be incorectly configured.
			//The XDG documentation indicates that the folder should be ignored but that the program should continue.
			std::cerr << "Skipping path \"" << value << "\" in \"" << envName << "\" because it does not start with a \"/\"\n";
		}
	}
}